

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_start_twice(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t once;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&once);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_timer_start(&once,never_cb,86400000,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_timer_start(&once,twice_cb,10,0);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = 1;
          eval_b = (int64_t)twice_cb_called;
          if (eval_b == 1) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            eval_a = 0;
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(uv_default_loop())";
            pcVar3 = "0";
            uVar2 = 0xb3;
          }
          else {
            pcVar4 = "twice_cb_called";
            pcVar3 = "1";
            uVar2 = 0xb1;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0xaf;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0xad;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0xab;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0xa9;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(timer_start_twice) {
  uv_timer_t once;
  int r;

  r = uv_timer_init(uv_default_loop(), &once);
  ASSERT_OK(r);
  r = uv_timer_start(&once, never_cb, 86400 * 1000, 0);
  ASSERT_OK(r);
  r = uv_timer_start(&once, twice_cb, 10, 0);
  ASSERT_OK(r);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, twice_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}